

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringEq(PrintExpressionContents *this,StringEq *curr)

{
  ostream *poVar1;
  string_view local_38;
  string_view local_28;
  StringEq *local_18;
  StringEq *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (StringEq *)this;
  if (curr->op == StringEqEqual) {
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"string.eq");
    printMedium(poVar1,local_28);
  }
  else {
    if (curr->op != StringEqCompare) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9ea);
    }
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"string.compare");
    printMedium(poVar1,local_38);
  }
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
    switch (curr->op) {
      case StringEqEqual:
        printMedium(o, "string.eq");
        break;
      case StringEqCompare:
        printMedium(o, "string.compare");
        break;
      default:
        WASM_UNREACHABLE("invalid string.eq*");
    }
  }